

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

double get_noise_var(uint8_t *data,uint8_t *denoised,int w,int h,int stride,int x_o,int y_o,
                    int block_size_x,int block_size_y,int use_highbd)

{
  int in_ECX;
  int in_EDX;
  uint16_t *in_RSI;
  uint16_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined8 local_8;
  
  if (x_o == 0) {
    local_8 = get_noise_var_lowbd((uint8_t *)in_RDI,(uint8_t *)in_RSI,in_EDX,in_ECX,in_R8D,in_R9D,
                                  in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  else {
    local_8 = get_noise_var_highbd
                        (in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,
                         in_stack_00000010,in_stack_00000018);
  }
  return local_8;
}

Assistant:

static inline double get_noise_var(const uint8_t *data, const uint8_t *denoised,
                                   int w, int h, int stride, int x_o, int y_o,
                                   int block_size_x, int block_size_y,
                                   int use_highbd) {
  if (use_highbd)
    return get_noise_var_highbd((const uint16_t *)data,
                                (const uint16_t *)denoised, w, h, stride, x_o,
                                y_o, block_size_x, block_size_y);
  return get_noise_var_lowbd(data, denoised, w, h, stride, x_o, y_o,
                             block_size_x, block_size_y);
}